

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O2

bool vkt::sr::anon_unknown_0::reverifyConstantDerivateWithFlushRelaxations
               (TestLog *log,ConstPixelBufferAccess *result,PixelBufferAccess *errorMask,
               DataType dataType,Precision precision,Vec4 *derivScale,Vec4 *derivBias,
               Vec4 *surfaceThreshold,DerivateFunc derivateFunc,Linear2DFunctionEvaluator *function)

{
  ostringstream *poVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  int iVar7;
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  bool bVar15;
  DataType DVar16;
  int numMantissaBits;
  int iVar17;
  int iVar18;
  int iVar19;
  MessageBuilder *pMVar20;
  int minExponent;
  int x;
  char *pcVar21;
  int y;
  int iVar22;
  ulong uVar23;
  int numAccurateBits;
  anon_unknown_0 *value;
  long lVar24;
  uint uVar25;
  uint uVar27;
  ulong uVar26;
  ulong uVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  uint uVar32;
  double dVar33;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  double dVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  double dVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  double dVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  double dVar57;
  Vec4 functionValueBackward;
  Vec4 functionValueForward;
  Interval numerator;
  Vec4 resultDerivative;
  Interval divisionRange;
  int local_330;
  char *local_2c0;
  undefined1 local_290 [32];
  Interval local_270;
  undefined1 local_258 [16];
  double dStack_248;
  undefined1 local_240 [16];
  double dStack_230;
  anon_unknown_0 local_228 [16];
  Interval local_218;
  undefined1 local_200 [24];
  IVec4 local_1e8;
  IVec4 local_1d8;
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [8];
  undefined8 local_1a8;
  void *pvStack_1a0;
  
  local_1d8.m_data[0] = 0xff;
  local_1d8.m_data[1] = 0;
  local_1d8.m_data[2] = 0;
  local_1d8.m_data[3] = 0xff;
  local_1e8.m_data[0] = 0;
  local_1e8.m_data[1] = 0xff;
  local_1e8.m_data[2] = 0;
  local_1e8.m_data[3] = 0xff;
  DVar16 = glu::getDataTypeFloatScalars(dataType);
  numAccurateBits = 0;
  minExponent = 0;
  if (precision < PRECISION_LAST) {
    numAccurateBits = *(int *)(&DAT_0098dc74 + (ulong)precision * 4);
    minExponent = *(int *)(&DAT_0098dc80 + (ulong)precision * 4);
  }
  numMantissaBits = numAccurateBits + -3;
  tcu::clear(errorMask,&local_1e8);
  uVar23 = (ulong)DVar16;
  if ((int)DVar16 < 1) {
    uVar23 = 0;
  }
  local_330 = 0;
  for (y = 0; y < (result->m_size).m_data[1]; y = y + 1) {
    fVar29 = (float)y;
    for (x = 0; x < (result->m_size).m_data[0]; x = x + 1) {
      readDerivate(local_228,result,derivScale,derivBias,x,y);
      fVar30 = (float)x;
      if (derivateFunc < DERIVATE_DFDY) {
        Linear2DFunctionEvaluator::evaluateAt
                  ((Linear2DFunctionEvaluator *)(local_290 + 0x10),fVar30 + 2.0,fVar29 + 0.5);
LAB_0057b5f1:
        fVar30 = fVar30 + 0.5;
        fVar31 = fVar29 + -1.0;
      }
      else {
        Linear2DFunctionEvaluator::evaluateAt
                  ((Linear2DFunctionEvaluator *)(local_290 + 0x10),fVar30 + 0.5,fVar29 + 2.0);
        if (2 < derivateFunc - DERIVATE_DFDY) goto LAB_0057b5f1;
        fVar30 = fVar30 + -1.0;
        fVar31 = fVar29 + 0.5;
      }
      Linear2DFunctionEvaluator::evaluateAt((Linear2DFunctionEvaluator *)local_290,fVar30,fVar31);
      iVar22 = 0;
      local_2c0 = "rgba";
      bVar15 = false;
      for (lVar24 = 0; uVar23 << 2 != lVar24; lVar24 = lVar24 + 4) {
        fVar30 = addErrorUlp(*(float *)(local_290 + lVar24 + 0x10),-0.5,numMantissaBits);
        fVar30 = convertFloatFlushToZeroRtn(fVar30,minExponent,numAccurateBits);
        fVar31 = addErrorUlp(*(float *)(local_290 + lVar24 + 0x10),0.5,numMantissaBits);
        fVar31 = convertFloatFlushToZeroRtp(fVar31,minExponent,numAccurateBits);
        local_240[0] = NAN(fVar30) || NAN(fVar31);
        uVar25 = -(uint)NAN(fVar30);
        uVar27 = -(uint)NAN(fVar31);
        auVar9._4_8_ = 0;
        auVar9._0_4_ = uVar25 & 0x7ff00000;
        auVar47._0_12_ = auVar9 << 0x20;
        auVar47._12_4_ = uVar27 & 0xfff00000;
        uVar32 = SUB84((double)fVar30,0);
        auVar40._0_4_ = ~uVar25 & uVar32;
        uVar36 = (uint)((ulong)(double)fVar30 >> 0x20);
        auVar40._4_4_ = ~uVar25 & uVar36;
        uVar37 = SUB84((double)fVar31,0);
        auVar40._8_4_ = ~uVar27 & uVar37;
        uVar38 = (uint)((ulong)(double)fVar31 >> 0x20);
        auVar40._12_4_ = ~uVar27 & uVar38;
        auVar54._0_4_ = ~uVar27 & uVar37;
        auVar54._4_4_ = ~uVar27 & uVar38;
        auVar54._8_4_ = ~uVar25 & uVar32;
        auVar54._12_4_ = ~uVar25 & uVar36;
        auVar10._4_8_ = 0;
        auVar10._0_4_ = uVar27 & 0x7ff00000;
        auVar2._12_4_ = uVar25 & 0xfff00000;
        auVar2._0_12_ = auVar10 << 0x20;
        auVar54 = auVar54 | auVar2;
        auVar40 = auVar40 | auVar47;
        uVar26 = -(ulong)(auVar40._0_8_ <= auVar54._0_8_);
        uVar28 = -(ulong)(auVar40._8_8_ <= auVar54._8_8_);
        auVar5._4_8_ = auVar47._8_8_;
        auVar5._0_4_ = auVar40._4_4_;
        auVar48._0_8_ = auVar5._0_8_ << 0x20;
        auVar48._8_4_ = auVar40._8_4_;
        auVar48._12_4_ = auVar40._12_4_;
        auVar41._0_4_ = auVar40._0_4_ & (uint)uVar26;
        auVar41._4_4_ = auVar40._4_4_ & (uint)(uVar26 >> 0x20);
        auVar41._8_4_ = auVar54._8_4_ & (uint)uVar28;
        auVar41._12_4_ = auVar54._12_4_ & (uint)(uVar28 >> 0x20);
        auVar34._0_8_ = ~uVar26 & (ulong)auVar54._0_8_;
        auVar34._8_8_ = ~uVar28 & auVar48._8_8_;
        stack0xfffffffffffffdc8 = auVar34 | auVar41;
        fVar30 = addErrorUlp(*(float *)(local_290 + lVar24),-0.5,numMantissaBits);
        fVar30 = convertFloatFlushToZeroRtn(fVar30,minExponent,numAccurateBits);
        fVar31 = addErrorUlp(*(float *)(local_290 + lVar24),0.5,numMantissaBits);
        fVar31 = convertFloatFlushToZeroRtp(fVar31,minExponent,numAccurateBits);
        local_258[0] = NAN(fVar30) || NAN(fVar31);
        uVar25 = -(uint)NAN(fVar30);
        uVar27 = -(uint)NAN(fVar31);
        auVar11._4_8_ = 0;
        auVar11._0_4_ = uVar25 & 0x7ff00000;
        auVar49._0_12_ = auVar11 << 0x20;
        auVar49._12_4_ = uVar27 & 0xfff00000;
        uVar32 = SUB84((double)fVar30,0);
        auVar42._0_4_ = ~uVar25 & uVar32;
        uVar36 = (uint)((ulong)(double)fVar30 >> 0x20);
        auVar42._4_4_ = ~uVar25 & uVar36;
        uVar37 = SUB84((double)fVar31,0);
        auVar42._8_4_ = ~uVar27 & uVar37;
        uVar38 = (uint)((ulong)(double)fVar31 >> 0x20);
        auVar42._12_4_ = ~uVar27 & uVar38;
        auVar55._0_4_ = ~uVar27 & uVar37;
        auVar55._4_4_ = ~uVar27 & uVar38;
        auVar55._8_4_ = ~uVar25 & uVar32;
        auVar55._12_4_ = ~uVar25 & uVar36;
        auVar12._4_8_ = 0;
        auVar12._0_4_ = uVar27 & 0x7ff00000;
        auVar3._12_4_ = uVar25 & 0xfff00000;
        auVar3._0_12_ = auVar12 << 0x20;
        auVar55 = auVar55 | auVar3;
        auVar42 = auVar42 | auVar49;
        uVar26 = -(ulong)(auVar42._0_8_ <= auVar55._0_8_);
        uVar28 = -(ulong)(auVar42._8_8_ <= auVar55._8_8_);
        auVar6._4_8_ = auVar49._8_8_;
        auVar6._0_4_ = auVar42._4_4_;
        auVar50._0_8_ = auVar6._0_8_ << 0x20;
        auVar50._8_4_ = auVar42._8_4_;
        auVar50._12_4_ = auVar42._12_4_;
        auVar43._0_4_ = auVar42._0_4_ & (uint)uVar26;
        auVar43._4_4_ = auVar42._4_4_ & (uint)(uVar26 >> 0x20);
        auVar43._8_4_ = auVar55._8_4_ & (uint)uVar28;
        auVar43._12_4_ = auVar55._12_4_ & (uint)(uVar28 >> 0x20);
        auVar35._0_8_ = ~uVar26 & (ulong)auVar55._0_8_;
        auVar35._8_8_ = ~uVar28 & auVar50._8_8_;
        register0x00001200 = auVar35 | auVar43;
        tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float
                  ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1b0,(double)local_240._8_8_);
        iVar17 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent
                           ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1b0);
        tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float
                  ((Float<unsigned_int,_8,_23,_127,_3U> *)&local_270,dStack_230);
        iVar18 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent
                           ((Float<unsigned_int,_8,_23,_127,_3U> *)&local_270);
        if (iVar18 < iVar17) {
          iVar18 = iVar17;
        }
        tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float
                  ((Float<unsigned_int,_8,_23,_127,_3U> *)local_200,(double)local_258._8_8_);
        iVar19 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent
                           ((Float<unsigned_int,_8,_23,_127,_3U> *)local_200);
        tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float
                  ((Float<unsigned_int,_8,_23,_127,_3U> *)&local_218,dStack_248);
        iVar17 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent
                           ((Float<unsigned_int,_8,_23,_127,_3U> *)&local_218);
        if (iVar17 < iVar19) {
          iVar17 = iVar19;
        }
        if (iVar17 < iVar18) {
          iVar17 = iVar18;
        }
        tcu::operator-(&local_270,(Interval *)local_240,(Interval *)local_258);
        tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float
                  ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1b0,local_270.m_lo);
        iVar18 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent
                           ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1b0);
        tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float
                  ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1b0,local_270.m_hi);
        iVar19 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent
                           ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1b0);
        iVar18 = iVar17 - iVar18;
        if (iVar18 < 1) {
          iVar18 = 0;
        }
        iVar7 = iVar17 - iVar19;
        if (iVar17 - iVar19 < 1) {
          iVar7 = 0;
        }
        iVar17 = numAccurateBits - iVar18;
        if (numAccurateBits - iVar18 < 1) {
          iVar17 = 0;
        }
        iVar18 = numAccurateBits - iVar7;
        if (numAccurateBits - iVar7 < 1) {
          iVar18 = 0;
        }
        fVar30 = convertFloatFlushToZeroRtn((float)local_270.m_lo,minExponent,iVar17);
        fVar31 = convertFloatFlushToZeroRtp((float)local_270.m_hi,minExponent,iVar18);
        local_200[0] = NAN(fVar30) || NAN(fVar31);
        uVar25 = -(uint)NAN(fVar30);
        uVar27 = -(uint)NAN(fVar31);
        auVar13._4_8_ = 0;
        auVar13._0_4_ = uVar25 & 0x7ff00000;
        auVar51._0_12_ = auVar13 << 0x20;
        auVar51._12_4_ = uVar27 & 0xfff00000;
        uVar32 = SUB84((double)fVar30,0);
        auVar44._0_4_ = ~uVar25 & uVar32;
        uVar36 = (uint)((ulong)(double)fVar30 >> 0x20);
        auVar44._4_4_ = ~uVar25 & uVar36;
        uVar37 = SUB84((double)fVar31,0);
        auVar44._8_4_ = ~uVar27 & uVar37;
        uVar38 = (uint)((ulong)(double)fVar31 >> 0x20);
        auVar44._12_4_ = ~uVar27 & uVar38;
        auVar56._0_4_ = ~uVar27 & uVar37;
        auVar56._4_4_ = ~uVar27 & uVar38;
        auVar56._8_4_ = ~uVar25 & uVar32;
        auVar56._12_4_ = ~uVar25 & uVar36;
        auVar14._4_8_ = 0;
        auVar14._0_4_ = uVar27 & 0x7ff00000;
        auVar4._12_4_ = uVar25 & 0xfff00000;
        auVar4._0_12_ = auVar14 << 0x20;
        auVar56 = auVar56 | auVar4;
        auVar44 = auVar44 | auVar51;
        uVar26 = -(ulong)(auVar44._0_8_ <= auVar56._0_8_);
        uVar28 = -(ulong)(auVar44._8_8_ <= auVar56._8_8_);
        auVar8._4_8_ = auVar51._8_8_;
        auVar8._0_4_ = auVar44._4_4_;
        auVar52._0_8_ = auVar8._0_8_ << 0x20;
        auVar52._8_4_ = auVar44._8_4_;
        auVar52._12_4_ = auVar44._12_4_;
        auVar45._0_4_ = auVar44._0_4_ & (uint)uVar26;
        auVar45._4_4_ = auVar44._4_4_ & (uint)(uVar26 >> 0x20);
        auVar45._8_4_ = auVar56._8_4_ & (uint)uVar28;
        auVar45._12_4_ = auVar56._12_4_ & (uint)(uVar28 >> 0x20);
        local_200._8_8_ = ~uVar26 & (ulong)auVar56._0_8_;
        local_200._16_8_ = ~uVar28 & auVar52._8_8_;
        local_200._8_16_ = local_200._8_16_ | auVar45;
        local_1b0 = (undefined1  [8])((ulong)local_1b0 & 0xffffffffffffff00);
        local_1a8 = 3.0;
        pvStack_1a0 = (void *)0x4008000000000000;
        tcu::operator/(&local_218,(Interval *)local_200,(Interval *)local_1b0);
        fVar30 = addErrorUlp((float)local_218.m_lo,-2.5,numAccurateBits);
        fVar30 = convertFloatFlushToZeroRtn(fVar30,minExponent,numAccurateBits);
        dVar33 = INFINITY;
        if (!NAN(fVar30)) {
          dVar33 = (double)fVar30;
        }
        dVar57 = -INFINITY;
        if (!NAN(fVar30)) {
          dVar57 = (double)fVar30;
        }
        fVar30 = addErrorUlp((float)local_218.m_hi,2.5,numAccurateBits);
        fVar30 = convertFloatFlushToZeroRtp(fVar30,minExponent,numAccurateBits);
        dVar46 = -INFINITY;
        dVar39 = INFINITY;
        if (!NAN(fVar30)) {
          dVar46 = (double)fVar30;
          dVar39 = dVar46;
        }
        dVar53 = (double)*(float *)((long)surfaceThreshold->m_data + lVar24);
        dVar39 = (double)(~-(ulong)(dVar33 <= dVar39) & (ulong)dVar39 |
                         (ulong)dVar33 & -(ulong)(dVar33 <= dVar39)) - dVar53;
        dVar33 = INFINITY;
        if (!NAN(dVar39)) {
          dVar33 = dVar39;
        }
        dVar53 = (double)(~-(ulong)(dVar46 <= dVar57) & (ulong)dVar46 |
                         (ulong)dVar57 & -(ulong)(dVar46 <= dVar57)) + dVar53;
        dVar57 = INFINITY;
        if (!NAN(dVar53)) {
          dVar57 = dVar53;
        }
        dVar46 = (double)(-(ulong)NAN(dVar39) & 0xfff0000000000000 |
                         ~-(ulong)NAN(dVar39) & (ulong)dVar39);
        dVar39 = (double)(-(ulong)NAN(dVar53) & 0xfff0000000000000 |
                         ~-(ulong)NAN(dVar53) & (ulong)dVar53);
        dVar57 = (double)(~-(ulong)(dVar33 <= dVar57) & (ulong)dVar57 |
                         (ulong)dVar33 & -(ulong)(dVar33 <= dVar57));
        uVar26 = -(ulong)(dVar39 <= dVar46);
        dVar33 = (double)(~uVar26 & (ulong)dVar39 | uVar26 & (ulong)dVar46);
        if (((double)*(float *)(local_228 + lVar24) < dVar57) ||
           (dVar33 < (double)*(float *)(local_228 + lVar24))) {
          if (local_330 < 10) {
            local_1b0 = (undefined1  [8])log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            std::operator<<((ostream *)&local_1a8,"Error in pixel at ");
            std::ostream::operator<<(&local_1a8,x);
            std::operator<<((ostream *)&local_1a8,", ");
            std::ostream::operator<<(&local_1a8,y);
            std::operator<<((ostream *)&local_1a8," with component ");
            std::ostream::operator<<(&local_1a8,iVar22);
            std::operator<<((ostream *)&local_1a8," (channel ");
            pMVar20 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,local_2c0);
            poVar1 = &pMVar20->m_str;
            std::operator<<((ostream *)poVar1,")\n");
            std::operator<<((ostream *)poVar1,"\tGot pixel value ");
            tcu::ConstPixelBufferAccess::getPixelInt
                      ((ConstPixelBufferAccess *)local_1c0,(int)result,x,y);
            tcu::operator<<((ostream *)poVar1,(Vector<int,_4> *)local_1c0);
            std::operator<<((ostream *)poVar1,"\n");
            std::operator<<((ostream *)poVar1,"\t\tdFd");
            std::operator<<((ostream *)poVar1,derivateFunc < DERIVATE_DFDY ^ 0x79);
            std::operator<<((ostream *)poVar1," ~= ");
            value = local_228 + lVar24;
            pMVar20 = tcu::MessageBuilder::operator<<(pMVar20,(float *)value);
            poVar1 = &pMVar20->m_str;
            std::operator<<((ostream *)poVar1,"\n");
            std::operator<<((ostream *)poVar1,"\t\tdifference to a valid range: ");
            pcVar21 = "+";
            if ((double)*(float *)value < dVar57) {
              pcVar21 = "-";
            }
            std::operator<<((ostream *)poVar1,pcVar21);
            dVar46 = (double)*(float *)value;
            std::ostream::_M_insert<double>
                      ((double)(~-(ulong)(dVar46 < dVar57) & (ulong)(dVar46 - dVar33) |
                               (ulong)(dVar57 - dVar46) & -(ulong)(dVar46 < dVar57)));
            std::operator<<((ostream *)poVar1,"\n");
            std::operator<<((ostream *)poVar1,"\tDerivative value range:\n");
            std::operator<<((ostream *)poVar1,"\t\tMin: ");
            std::ostream::_M_insert<double>(dVar57);
            std::operator<<((ostream *)poVar1,"\n");
            std::operator<<((ostream *)poVar1,"\t\tMax: ");
            std::ostream::_M_insert<double>(dVar33);
            std::operator<<((ostream *)poVar1,"\n");
            tcu::MessageBuilder::operator<<(pMVar20,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          }
          local_330 = local_330 + 1;
          bVar15 = true;
        }
        local_2c0 = local_2c0 + 1;
        iVar22 = iVar22 + 1;
      }
      if (bVar15) {
        tcu::PixelBufferAccess::setPixel(errorMask,&local_1d8,x,y,0);
      }
    }
  }
  if (local_330 < 10) {
    if (local_330 < 1) goto LAB_0057bef4;
  }
  else {
    local_1b0 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::operator<<((ostream *)&local_1a8,"...");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  }
  local_1b0 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::operator<<((ostream *)&local_1a8,"FAIL: found ");
  std::ostream::operator<<((ostringstream *)&local_1a8,local_330);
  std::operator<<((ostream *)&local_1a8," failed pixels");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
LAB_0057bef4:
  return local_330 == 0;
}

Assistant:

static bool reverifyConstantDerivateWithFlushRelaxations (tcu::TestLog&							log,
														  const tcu::ConstPixelBufferAccess&	result,
														  const tcu::PixelBufferAccess&			errorMask,
														  glu::DataType							dataType,
														  glu::Precision						precision,
														  const tcu::Vec4&						derivScale,
														  const tcu::Vec4&						derivBias,
														  const tcu::Vec4&						surfaceThreshold,
														  DerivateFunc							derivateFunc,
														  const Linear2DFunctionEvaluator&		function)
{
	DE_ASSERT(result.getWidth() == errorMask.getWidth());
	DE_ASSERT(result.getHeight() == errorMask.getHeight());
	DE_ASSERT(isDfdxFunc(derivateFunc) || isDfdyFunc(derivateFunc));

	const tcu::IVec4	red						(255, 0, 0, 255);
	const tcu::IVec4	green					(0, 255, 0, 255);
	const float			divisionErrorUlps		= 2.5f;

	const int			numComponents			= glu::getDataTypeFloatScalars(dataType);
	const int			numBits					= getNumMantissaBits(precision);
	const int			minExponent				= getMinExponent(precision);

	const int			numVaryingSampleBits	= numBits - INTERPOLATION_LOST_BITS;
	int					numFailedPixels			= 0;

	tcu::clear(errorMask, green);

	// search for failed pixels
	for (int y = 0; y < result.getHeight(); ++y)
	for (int x = 0; x < result.getWidth(); ++x)
	{
		//                 flushToZero?(f2z?(functionValueCurrent) - f2z?(functionValueBefore))
		// flushToZero? ( ------------------------------------------------------------------------ +- 2.5 ULP )
		//                                                  dx

		const tcu::Vec4	resultDerivative		= readDerivate(result, derivScale, derivBias, x, y);

		// sample at the front of the back pixel and the back of the front pixel to cover the whole area of
		// legal sample positions. In general case this is NOT OK, but we know that the target funtion is
		// (mostly*) linear which allows us to take the sample points at arbitrary points. This gets us the
		// maximum difference possible in exponents which are used in error bound calculations.
		// * non-linearity may happen around zero or with very high function values due to subnorms not
		//   behaving well.
		const tcu::Vec4	functionValueForward	= (isDfdxFunc(derivateFunc))
													? (function.evaluateAt((float)x + 2.0f, (float)y + 0.5f))
													: (function.evaluateAt((float)x + 0.5f, (float)y + 2.0f));
		const tcu::Vec4	functionValueBackward	= (isDfdyFunc(derivateFunc))
													? (function.evaluateAt((float)x - 1.0f, (float)y + 0.5f))
													: (function.evaluateAt((float)x + 0.5f, (float)y - 1.0f));

		bool	anyComponentFailed				= false;

		// check components separately
		for (int c = 0; c < numComponents; ++c)
		{
			// Simulate interpolation. Add allowed interpolation error and round to target precision. Allow one half ULP (i.e. correct rounding)
			const tcu::Interval	forwardComponent		(convertFloatFlushToZeroRtn(addErrorUlp((float)functionValueForward[c],  -0.5f, numVaryingSampleBits), minExponent, numBits),
														 convertFloatFlushToZeroRtp(addErrorUlp((float)functionValueForward[c],  +0.5f, numVaryingSampleBits), minExponent, numBits));
			const tcu::Interval	backwardComponent		(convertFloatFlushToZeroRtn(addErrorUlp((float)functionValueBackward[c], -0.5f, numVaryingSampleBits), minExponent, numBits),
														 convertFloatFlushToZeroRtp(addErrorUlp((float)functionValueBackward[c], +0.5f, numVaryingSampleBits), minExponent, numBits));
			const int			maxValueExp				= de::max(de::max(tcu::Float32(forwardComponent.lo()).exponent(),   tcu::Float32(forwardComponent.hi()).exponent()),
																  de::max(tcu::Float32(backwardComponent.lo()).exponent(),  tcu::Float32(backwardComponent.hi()).exponent()));

			// subtraction in numerator will likely cause a cancellation of the most
			// significant bits. Apply error bounds.

			const tcu::Interval	numerator				(forwardComponent - backwardComponent);
			const int			numeratorLoExp			= tcu::Float32(numerator.lo()).exponent();
			const int			numeratorHiExp			= tcu::Float32(numerator.hi()).exponent();
			const int			numeratorLoBitsLost		= de::max(0, maxValueExp - numeratorLoExp); //!< must clamp to zero since if forward and backward components have different
			const int			numeratorHiBitsLost		= de::max(0, maxValueExp - numeratorHiExp); //!< sign, numerator might have larger exponent than its operands.
			const int			numeratorLoBits			= de::max(0, numBits - numeratorLoBitsLost);
			const int			numeratorHiBits			= de::max(0, numBits - numeratorHiBitsLost);

			const tcu::Interval	numeratorRange			(convertFloatFlushToZeroRtn((float)numerator.lo(), minExponent, numeratorLoBits),
														 convertFloatFlushToZeroRtp((float)numerator.hi(), minExponent, numeratorHiBits));

			const tcu::Interval	divisionRange			= numeratorRange / 3.0f; // legal sample area is anywhere within this and neighboring pixels (i.e. size = 3)
			const tcu::Interval	divisionResultRange		(convertFloatFlushToZeroRtn(addErrorUlp((float)divisionRange.lo(), -divisionErrorUlps, numBits), minExponent, numBits),
														 convertFloatFlushToZeroRtp(addErrorUlp((float)divisionRange.hi(), +divisionErrorUlps, numBits), minExponent, numBits));
			const tcu::Interval	finalResultRange		(divisionResultRange.lo() - surfaceThreshold[c], divisionResultRange.hi() + surfaceThreshold[c]);

			if (resultDerivative[c] >= finalResultRange.lo() && resultDerivative[c] <= finalResultRange.hi())
			{
				// value ok
			}
			else
			{
				if (numFailedPixels < MAX_FAILED_MESSAGES)
					log << tcu::TestLog::Message
						<< "Error in pixel at " << x << ", " << y << " with component " << c << " (channel " << ("rgba"[c]) << ")\n"
						<< "\tGot pixel value " << result.getPixelInt(x, y) << "\n"
						<< "\t\tdFd" << ((isDfdxFunc(derivateFunc)) ? ('x') : ('y')) << " ~= " << resultDerivative[c] << "\n"
						<< "\t\tdifference to a valid range: "
							<< ((resultDerivative[c] < finalResultRange.lo()) ? ("-") : ("+"))
							<< ((resultDerivative[c] < finalResultRange.lo()) ? (finalResultRange.lo() - resultDerivative[c]) : (resultDerivative[c] - finalResultRange.hi()))
							<< "\n"
						<< "\tDerivative value range:\n"
						<< "\t\tMin: " << finalResultRange.lo() << "\n"
						<< "\t\tMax: " << finalResultRange.hi() << "\n"
						<< tcu::TestLog::EndMessage;

				++numFailedPixels;
				anyComponentFailed = true;
			}
		}

		if (anyComponentFailed)
			errorMask.setPixel(red, x, y);
	}

	if (numFailedPixels >= MAX_FAILED_MESSAGES)
		log << TestLog::Message << "..." << TestLog::EndMessage;

	if (numFailedPixels > 0)
		log << TestLog::Message << "FAIL: found " << numFailedPixels << " failed pixels" << TestLog::EndMessage;

	return numFailedPixels == 0;
}